

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mcu8str_create_from_cstr(char *c_str)

{
  mcu8str_size_t prealloc_size;
  char *in_RSI;
  mcu8str *in_RDI;
  mcu8str_size_t o_size;
  mcu8str *pmVar1;
  char *in_stack_fffffffffffffff0;
  
  if (*in_RSI == '\0') {
    mcu8str_create_empty();
    pmVar1 = in_RDI;
  }
  else {
    pmVar1 = in_RDI;
    prealloc_size = mctools_strlen(in_stack_fffffffffffffff0,(mcu8str_size_t)in_RDI);
    mcu8str_create(prealloc_size);
    memcpy(in_RDI->c_str,in_RSI,prealloc_size + 1);
    in_RDI->size = (uint)prealloc_size;
  }
  return pmVar1;
}

Assistant:

mcu8str mcu8str_create_from_cstr( const char * c_str )
  {
    if ( ! *c_str )
      return mcu8str_create_empty();
    const mcu8str_size_t o_size = mctools_strlen( c_str, 0 );
    assert( o_size > 0 );
    mcu8str str = mcu8str_create( o_size );
    //str.c_str is newly allocated, so there can be no overlap:
    STDNS memcpy( str.c_str, c_str, o_size + 1 );
    str.size = (unsigned)o_size;//cast ok, mctools_strlen checked.
    return str;
  }